

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::value_and_holder::set_holder_constructed(value_and_holder *this,bool v)

{
  uint8_t *puVar1;
  bool v_local;
  value_and_holder *this_local;
  
  if (((byte)this->inst->field_0x30 >> 1 & 1) == 0) {
    if (v) {
      puVar1 = (this->inst->field_1).nonsimple.status;
      puVar1[this->index] = puVar1[this->index] | 1;
    }
    else {
      puVar1 = (this->inst->field_1).nonsimple.status;
      puVar1[this->index] = puVar1[this->index] & 0xfe;
    }
  }
  else {
    this->inst->field_0x30 = this->inst->field_0x30 & 0xfb | v << 2;
  }
  return;
}

Assistant:

void set_holder_constructed(bool v = true) {
        if (inst->simple_layout)
            inst->simple_holder_constructed = v;
        else if (v)
            inst->nonsimple.status[index] |= instance::status_holder_constructed;
        else
            inst->nonsimple.status[index] &= (std::uint8_t) ~instance::status_holder_constructed;
    }